

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O0

bool __thiscall serial::Serial::SerialImpl::getDSR(SerialImpl *this)

{
  int iVar1;
  PortNotOpenedException *this_00;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  SerialException *this_01;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  uint local_20 [2];
  int status;
  SerialImpl *local_10;
  SerialImpl *this_local;
  
  local_10 = this;
  if ((this->is_open_ & 1U) == 0) {
    this_00 = (PortNotOpenedException *)__cxa_allocate_exception(0x48);
    PortNotOpenedException::PortNotOpenedException(this_00,"Serial::getDSR");
    __cxa_throw(this_00,&PortNotOpenedException::typeinfo,
                PortNotOpenedException::~PortNotOpenedException);
  }
  iVar1 = ioctl(this->fd_,0x5415,local_20);
  if (iVar1 == -1) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar2 = std::operator<<(local_198,"getDSR failed on a call to ioctl(TIOCMGET): ");
    piVar3 = __errno_location();
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar3);
    poVar2 = std::operator<<(poVar2," ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    this_01 = (SerialException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    SerialException::SerialException(this_01,pcVar4);
    __cxa_throw(this_01,&SerialException::typeinfo,SerialException::~SerialException);
  }
  return (local_20[0] & 0x100) != 0;
}

Assistant:

bool
Serial::SerialImpl::getDSR ()
{
  if (is_open_ == false) {
    throw PortNotOpenedException ("Serial::getDSR");
  }

  int status;

  if (-1 == ioctl (fd_, TIOCMGET, &status))
  {
      stringstream ss;
      ss << "getDSR failed on a call to ioctl(TIOCMGET): " << errno << " " << strerror(errno);
      throw(SerialException(ss.str().c_str()));
  }
  else
  {
      return 0 != (status & TIOCM_DSR);
  }
}